

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::Kick(World *this,Command_Source *from,Character *victim,bool announce)

{
  undefined7 in_register_00000009;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000009,announce) != 0) {
    std::__cxx11::string::string((string *)&local_60,"announce_removed",&local_e1);
    (*(victim->super_Command_Source)._vptr_Command_Source[2])(&local_80,victim);
    if (from == (Command_Source *)0x0) {
      std::__cxx11::string::string((string *)&local_e0,"server",&local_e2);
    }
    else {
      (*from->_vptr_Command_Source[2])(&local_e0,from);
    }
    std::__cxx11::string::string((string *)&local_c0,"kicked",&local_e3);
    I18N::Format<>(&local_a0,&this->i18n,&local_c0);
    I18N::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_40,&this->i18n,&local_60,&local_80,&local_e0,&local_a0);
    ServerMsg(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  Client::Close(&victim->player->client->super_Client,false);
  return;
}

Assistant:

void World::Kick(Command_Source *from, Character *victim, bool announce)
{
	if (announce)
		this->ServerMsg(i18n.Format("announce_removed", victim->SourceName(), from ? from->SourceName() : "server", i18n.Format("kicked")));

	victim->player->client->Close();
}